

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>::
AdapterPromiseNode<kj::Canceler&,kj::Promise<unsigned_long>>
          (AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>> *this,
          Canceler *params,Promise<unsigned_long> *params_1)

{
  PromiseBase node;
  PromiseBase local_20;
  
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined ***)this = &PTR_destroy_006e14a8;
  *(undefined ***)(this + 0x18) = &PTR_reject_006e14f8;
  this[0x20] = (AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>)0x0;
  this[0x1b8] = (AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>)0x0;
  this[0x1c8] = (AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>)0x1;
  local_20.node.ptr = (OwnPromiseNode)(params_1->super_PromiseBase).node.ptr;
  (params_1->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
  Canceler::AdapterImpl<unsigned_long>::AdapterImpl
            ((AdapterImpl<unsigned_long> *)(this + 0x1d0),
             (PromiseFulfiller<unsigned_long> *)(this + 0x18),params,
             (Promise<unsigned_long> *)&local_20);
  node.node.ptr = local_20.node.ptr;
  if (local_20.node.ptr != (PromiseNode *)0x0) {
    local_20.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    PromiseDisposer::dispose((PromiseArenaMember *)node.node.ptr);
  }
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}